

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tree.h
# Opt level: O2

void __thiscall Tree<int>::levelTraversal(Tree<int> *this)

{
  Node<int> *node;
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  queue<Node<int>_*,_std::deque<Node<int>_*,_std::allocator<Node<int>_*>_>_> myQueue;
  Node<int> *local_80;
  _Deque_base<Node<int>_*,_std::allocator<Node<int>_*>_> local_78;
  
  iVar1 = (*this->_vptr_Tree[8])();
  if (CONCAT44(extraout_var,iVar1) != 0) {
    std::queue<Node<int>*,std::deque<Node<int>*,std::allocator<Node<int>*>>>::
    queue<std::deque<Node<int>*,std::allocator<Node<int>*>>,void>
              ((queue<Node<int>_*,_std::deque<Node<int>_*,_std::allocator<Node<int>_*>_>_> *)
               &local_78);
    iVar1 = (*this->_vptr_Tree[8])(this);
    local_80 = (Node<int> *)CONCAT44(extraout_var_00,iVar1);
    std::deque<Node<int>*,std::allocator<Node<int>*>>::emplace_back<Node<int>*>
              ((deque<Node<int>*,std::allocator<Node<int>*>> *)&local_78,&local_80);
    local_80 = (Node<int> *)0x0;
    std::deque<Node<int>*,std::allocator<Node<int>*>>::emplace_back<Node<int>*>
              ((deque<Node<int>*,std::allocator<Node<int>*>> *)&local_78,&local_80);
    do {
      node = *local_78._M_impl.super__Deque_impl_data._M_start._M_cur;
      std::deque<Node<int>_*,_std::allocator<Node<int>_*>_>::pop_front
                ((deque<Node<int>_*,_std::allocator<Node<int>_*>_> *)&local_78);
      if (node == (Node<int> *)0x0) {
        if (local_78._M_impl.super__Deque_impl_data._M_finish._M_cur !=
            local_78._M_impl.super__Deque_impl_data._M_start._M_cur) {
          local_80 = (Node<int> *)0x0;
          std::deque<Node<int>*,std::allocator<Node<int>*>>::emplace_back<Node<int>*>
                    ((deque<Node<int>*,std::allocator<Node<int>*>> *)&local_78,&local_80);
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        }
      }
      else {
        doSomeThing(this,node);
        iVar1 = (**node->_vptr_Node)(node);
        if (CONCAT44(extraout_var_01,iVar1) != 0) {
          iVar1 = (**node->_vptr_Node)(node);
          local_80 = (Node<int> *)CONCAT44(extraout_var_02,iVar1);
          std::deque<Node<int>*,std::allocator<Node<int>*>>::emplace_back<Node<int>*>
                    ((deque<Node<int>*,std::allocator<Node<int>*>> *)&local_78,&local_80);
        }
        iVar1 = (*node->_vptr_Node[8])(node);
        if (CONCAT44(extraout_var_03,iVar1) != 0) {
          iVar1 = (*node->_vptr_Node[8])(node);
          local_80 = (Node<int> *)CONCAT44(extraout_var_04,iVar1);
          std::deque<Node<int>*,std::allocator<Node<int>*>>::emplace_back<Node<int>*>
                    ((deque<Node<int>*,std::allocator<Node<int>*>> *)&local_78,&local_80);
        }
      }
    } while (local_78._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_78._M_impl.super__Deque_impl_data._M_start._M_cur);
    std::_Deque_base<Node<int>_*,_std::allocator<Node<int>_*>_>::~_Deque_base(&local_78);
  }
  return;
}

Assistant:

virtual void levelTraversal(void){
        if (getRoot() == nullptr){
            return;
        }
        queue<Node<T>*> myQueue;
        myQueue.push(getRoot());
        myQueue.push(0); // nullptr

        do{
            Node<T>* node = myQueue.front();
            myQueue.pop();
            if (node){ // node != nullptr
                doSomeThing(node);
                if (node->getLeftPoint() != nullptr){
                    myQueue.push( node->getLeftPoint());
                }
                if (node->getRightPoint() != nullptr){
                    myQueue.push(node->getRightPoint());
                }
            } else{
                if (!myQueue.empty()){
                    //end the the level
                    myQueue.push(0);
                    cout << endl;
                }
            }
        }while (!myQueue.empty());
    }